

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

void sysbvm_type_setMethodWithSelector
               (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector,
               sysbvm_tuple_t method)

{
  _Bool _Var1;
  uint uVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  
  if ((type & 0xf) != 0 || type == 0) {
    return;
  }
  if (*(long *)(type + 0x90) == 0) {
    sVar3 = sysbvm_methodDictionary_create(context);
    *(sysbvm_tuple_t *)(type + 0x90) = sVar3;
  }
  sysbvm_methodDictionary_atPut(context,*(sysbvm_tuple_t *)(type + 0x90),selector,method);
  sysbvm_function_recordBindingWithOwnerAndName(context,method,type,selector);
  if ((method & 0xf) == 0 && method != 0) {
    uVar4 = *(ulong *)method;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar2 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar2 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
    }
    else {
      uVar2 = 0;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      uVar4 = *(ulong *)(method + 0x28);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar4 = (long)uVar4 >> 4;
      }
      else {
        uVar4 = *(ulong *)(uVar4 + 0x10);
      }
      goto LAB_00146b3d;
    }
  }
  uVar4 = 0;
LAB_00146b3d:
  if ((uVar4 & 0xe0) != 0) {
    if (*(long *)(type + 0xb8) == 0) {
      sVar3 = sysbvm_orderedCollection_create(context);
      *(sysbvm_tuple_t *)(type + 0xb8) = sVar3;
    }
    _Var1 = sysbvm_orderedCollection_identityIncludes(*(sysbvm_tuple_t *)(type + 0xb8),selector);
    if (!_Var1) {
      sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(type + 0xb8),selector);
      return;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_setMethodWithSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector, sysbvm_tuple_t method)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;

    sysbvm_type_tuple_t* typeObject = (sysbvm_type_tuple_t*)type;
    if(!typeObject->methodDictionary)
        typeObject->methodDictionary = sysbvm_methodDictionary_create(context);
    sysbvm_methodDictionary_atPut(context, typeObject->methodDictionary, selector, method);
    sysbvm_function_recordBindingWithOwnerAndName(context, method, type, selector);

    if((sysbvm_function_getFlags(context, method) & SYSBVM_FUNCTION_FLAGS_VIRTUAL_DISPATCH_FLAGS) != 0)
    {
        if(!typeObject->virtualMethodSelectorList)
            typeObject->virtualMethodSelectorList = sysbvm_orderedCollection_create(context);

        if(!sysbvm_orderedCollection_identityIncludes(typeObject->virtualMethodSelectorList, selector))
            sysbvm_orderedCollection_add(context, typeObject->virtualMethodSelectorList, selector);
    }
}